

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O0

uchar * wal_q2_read_header(uchar *buffer,wal_q2_header *out)

{
  uint32_t uVar1;
  uchar *local_28;
  uchar *ptr;
  wal_q2_header *pwStack_18;
  int i;
  wal_q2_header *out_local;
  uchar *buffer_local;
  
  *(undefined8 *)out->name = *(undefined8 *)buffer;
  *(undefined8 *)(out->name + 8) = *(undefined8 *)(buffer + 8);
  *(undefined8 *)(out->name + 0x10) = *(undefined8 *)(buffer + 0x10);
  *(undefined8 *)(out->name + 0x18) = *(undefined8 *)(buffer + 0x18);
  local_28 = buffer + 0x20;
  pwStack_18 = out;
  out_local = (wal_q2_header *)buffer;
  uVar1 = read_le32(&local_28);
  pwStack_18->width = uVar1;
  uVar1 = read_le32(&local_28);
  pwStack_18->height = uVar1;
  for (ptr._4_4_ = 0; ptr._4_4_ < 4; ptr._4_4_ = ptr._4_4_ + 1) {
    uVar1 = read_le32(&local_28);
    pwStack_18->offsets[ptr._4_4_] = uVar1;
  }
  *(undefined8 *)pwStack_18->animname = *(undefined8 *)local_28;
  *(undefined8 *)(pwStack_18->animname + 8) = *(undefined8 *)(local_28 + 8);
  *(undefined8 *)(pwStack_18->animname + 0x10) = *(undefined8 *)(local_28 + 0x10);
  *(undefined8 *)(pwStack_18->animname + 0x18) = *(undefined8 *)(local_28 + 0x18);
  local_28 = local_28 + 0x20;
  uVar1 = read_le32(&local_28);
  pwStack_18->flags = uVar1;
  uVar1 = read_le32(&local_28);
  pwStack_18->contents = uVar1;
  uVar1 = read_le32(&local_28);
  pwStack_18->value = uVar1;
  return local_28;
}

Assistant:

unsigned char *wal_q2_read_header(const unsigned char *buffer,
								  struct wal_q2_header *out)
{
	int i;
	unsigned char *ptr = (unsigned char *)buffer;
	memcpy(&(out->name), ptr, NAME_LEN);
	ptr += NAME_LEN;
	out->width = read_le32(&ptr);
	out->height = read_le32(&ptr);
	for (i = 0; i < MIP_LEVELS_Q2; i++) {
		out->offsets[i] = read_le32(&ptr);
	}
	memcpy(&(out->animname), ptr, NAME_LEN);
	ptr += NAME_LEN;
	out->flags = read_le32(&ptr);
	out->contents = read_le32(&ptr);
	out->value = read_le32(&ptr);
	return ptr;
}